

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O2

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::fix_after_remove(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,node *t)

{
  node **ppnVar1;
  node *t_00;
  node *pnVar2;
  node *t_01;
  node **ppnVar3;
  
  ppnVar1 = &this->tree_root;
  do {
    if ((t == *ppnVar1) || (t->color != '\x01')) {
      t->color = '\x01';
      return;
    }
    ppnVar3 = &t->parent;
    t_01 = t->parent;
    t_00 = t_01->left;
    if (t_00 == t) {
      t_00 = t_01->right;
      if (t_00->color == '\0') {
        t_00->color = '\x01';
        t_01->color = '\0';
        rotate_left(this,t_01);
        t_01 = *ppnVar3;
        t_00 = t_01->right;
      }
      pnVar2 = t_00->right;
      if (t_00->left->color == '\x01') {
        if (pnVar2->color == '\x01') goto LAB_002656d2;
      }
      else if (pnVar2->color == '\x01') {
        t_00->left->color = '\x01';
        t_00->color = '\0';
        rotate_right(this,t_00);
        t_01 = *ppnVar3;
        t_00 = t_01->right;
        pnVar2 = t_00->right;
      }
      t_00->color = t_01->color;
      t_01->color = '\x01';
      pnVar2->color = '\x01';
      rotate_left(this,t_01);
      ppnVar3 = ppnVar1;
    }
    else {
      if (t_00->color == '\0') {
        t_00->color = '\x01';
        t_01->color = '\0';
        rotate_right(this,t_01);
        t_01 = *ppnVar3;
        t_00 = t_01->left;
      }
      pnVar2 = t_00->left;
      if (pnVar2->color == '\x01') {
        if (t_00->right->color == '\x01') {
LAB_002656d2:
          t_00->color = '\0';
          goto LAB_00265715;
        }
        t_00->right->color = '\x01';
        t_00->color = '\0';
        rotate_left(this,t_00);
        t_01 = *ppnVar3;
        t_00 = t_01->left;
        pnVar2 = t_00->left;
      }
      t_00->color = t_01->color;
      t_01->color = '\x01';
      pnVar2->color = '\x01';
      rotate_right(this,t_01);
      ppnVar3 = ppnVar1;
    }
LAB_00265715:
    t = *ppnVar3;
  } while( true );
}

Assistant:

void binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    fix_after_remove (
        node* t
    )
    {

        while (t != tree_root && t->color == black)
        {
            if (t->parent->left == t)
            {
                node* sibling = t->parent->right;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_left(t->parent);
                    sibling = t->parent->right;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->right->color == black)
                    {
                        sibling->left->color = black;
                        sibling->color = red;
                        rotate_right(sibling);
                        sibling = t->parent->right;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->right->color = black;
                    rotate_left(t->parent);
                    t = tree_root;

                }


            }
            else
            {

                node* sibling = t->parent->left;
                if (sibling->color == red)
                {
                    sibling->color = black;
                    t->parent->color = red;
                    rotate_right(t->parent);
                    sibling = t->parent->left;
                }

                if (sibling->left->color == black && sibling->right->color == black)
                {
                    sibling->color = red;
                    t = t->parent;
                }
                else
                {
                    if (sibling->left->color == black)
                    {
                        sibling->right->color = black;
                        sibling->color = red;
                        rotate_left(sibling);
                        sibling = t->parent->left;
                    }

                    sibling->color = t->parent->color;
                    t->parent->color = black;
                    sibling->left->color = black;
                    rotate_right(t->parent);
                    t = tree_root;

                }


            }

        }
        t->color = black;
    
    }